

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O3

HaF32 * __thiscall
HACD::MyWuQuantizer::kmeansQuantize3D
          (MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices,bool denormalizeResults,
          HaU32 maxVertices,HaU32 *outputCount)

{
  Vec3Vector *this_00;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar4;
  Vec3 *pVVar7;
  HaU32 HVar8;
  uint uVar9;
  uint uVar10;
  Vec3d<float> *clusters;
  HaU32 *outputIndices;
  uint uVar11;
  Vec3 *pVVar12;
  ulong uVar13;
  uint uVar14;
  Vec3d<float> *_output;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  HaF32 HVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  pVVar12 = (Vec3 *)0x0;
  *outputCount = 0;
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  if (vcount != 0) {
    normalizeInput(this,vcount,vertices);
    clusters = (Vec3d<float> *)malloc((ulong)vcount * 0xc);
    outputIndices = (HaU32 *)malloc((ulong)vcount * 4);
    if ((this->mNormalizedInput).mSize == 0) {
LAB_0084ea3b:
      __assert_fail("i < mSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                    ,0x93,"T &hacd::vector<HACD::Vec3>::operator[](HaU32) [T = HACD::Vec3]");
    }
    HVar8 = kmeans_cluster<HACD::Vec3d<float>,float>
                      ((Vec3d<float> *)(this->mNormalizedInput).mData,vcount,maxVertices,clusters,
                       outputIndices,0.01,0.0001);
    *outputCount = HVar8;
    if (HVar8 == 0) {
      pVVar12 = (Vec3 *)0x0;
    }
    else {
      this_00 = &this->mQuantizedOutput;
      if (denormalizeResults) {
        uVar10 = (this->mQuantizedOutput).mSize;
        uVar14 = 0;
        uVar13 = 0;
        do {
          uVar2 = (this->mScale).y;
          uVar5 = (this->mScale).z;
          auVar18._4_4_ = uVar5;
          auVar18._0_4_ = uVar2;
          auVar18._8_8_ = 0;
          uVar3 = (this->mCenter).y;
          uVar6 = (this->mCenter).z;
          auVar19._4_4_ = uVar6;
          auVar19._0_4_ = uVar3;
          auVar19._8_8_ = 0;
          auVar16 = vfmadd213ss_fma(ZEXT416((uint)(this->mScale).x),
                                    ZEXT416((uint)(&clusters->x)[uVar14]),
                                    ZEXT416((uint)(this->mCenter).x));
          uVar11 = (this->mQuantizedOutput).mCapacity & 0x7fffffff;
          uVar9 = uVar10;
          if (uVar11 <= uVar10) {
            uVar10 = uVar11 * 2;
            if (uVar11 == 0) {
              uVar10 = 1;
            }
            if (uVar10 <= uVar11) {
LAB_0084ea1c:
              __assert_fail("this->capacity() < capacity",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                            ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
            }
            hacd::vector<HACD::Vec3>::recreate(this_00,uVar10);
            uVar9 = (this->mQuantizedOutput).mSize;
          }
          HVar17 = auVar16._0_4_;
          auVar15._4_4_ = HVar17;
          auVar15._0_4_ = HVar17;
          auVar15._8_4_ = HVar17;
          auVar15._12_4_ = HVar17;
          pVVar12 = (this->mQuantizedOutput).mData;
          uVar10 = uVar9 + 1;
          uVar13 = uVar13 + 1;
          uVar14 = uVar14 + 3;
          auVar16 = vfmadd213ps_fma(auVar18,auVar15,auVar19);
          pVVar12[uVar9].x = HVar17;
          pVVar12 = pVVar12 + uVar9;
          uVar4 = vmovlps_avx(auVar16);
          pVVar12->y = (HaF32)(int)uVar4;
          pVVar12->z = (HaF32)(int)((ulong)uVar4 >> 0x20);
          (this->mQuantizedOutput).mSize = uVar10;
        } while (uVar13 < *outputCount);
      }
      else {
        uVar10 = (this->mQuantizedOutput).mSize;
        uVar14 = 0;
        uVar13 = 0;
        do {
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(&clusters->x + uVar14);
          fVar1 = (&clusters->z)[uVar14];
          uVar11 = (this->mQuantizedOutput).mCapacity & 0x7fffffff;
          uVar9 = uVar10;
          if (uVar11 <= uVar10) {
            uVar10 = uVar11 * 2;
            if (uVar11 == 0) {
              uVar10 = 1;
            }
            if (uVar10 <= uVar11) goto LAB_0084ea1c;
            hacd::vector<HACD::Vec3>::recreate(this_00,uVar10);
            uVar9 = (this->mQuantizedOutput).mSize;
          }
          pVVar7 = (this->mQuantizedOutput).mData;
          uVar10 = uVar9 + 1;
          uVar13 = uVar13 + 1;
          uVar14 = uVar14 + 3;
          pVVar12 = pVVar7 + uVar9;
          uVar4 = vmovlps_avx(auVar16);
          pVVar12->x = (HaF32)(int)uVar4;
          pVVar12->y = (HaF32)(int)((ulong)uVar4 >> 0x20);
          pVVar7[uVar9].z = (HaF32)fVar1;
          (this->mQuantizedOutput).mSize = uVar10;
        } while (uVar13 < *outputCount);
      }
      if (uVar10 == 0) goto LAB_0084ea3b;
      pVVar12 = this_00->mData;
    }
    free(clusters);
    free(outputIndices);
  }
  return &pVVar12->x;
}

Assistant:

virtual const hacd::HaF32 * kmeansQuantize3D(hacd::HaU32 vcount,
		const hacd::HaF32 *vertices,
		bool denormalizeResults,
		hacd::HaU32 maxVertices,
		hacd::HaU32 &outputCount)
	{
		const hacd::HaF32 *ret = NULL;
		outputCount = 0;
		mNormalizedInput.clear();
		mQuantizedOutput.clear();

		if ( vcount > 0 )
		{
			normalizeInput(vcount,vertices);
			HaF32 *quantizedOutput = (HaF32 *)HACD_ALLOC( sizeof(HaF32)*3*vcount);
			HaU32 *quantizedIndices = (HaU32 *)HACD_ALLOC( sizeof(HaU32)*vcount );
			outputCount = kmeans_cluster3d(&mNormalizedInput[0].x, vcount, maxVertices, quantizedOutput, quantizedIndices, 0.01f, 0.0001f );
			if ( outputCount > 0 )
			{
				if ( denormalizeResults )
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						v.x = v.x*mScale.x + mCenter.x;
						v.y = v.x*mScale.y + mCenter.y;
						v.z = v.x*mScale.z + mCenter.z;
						mQuantizedOutput.push_back(v);
					}
				}
				else
				{
					for (HaU32 i=0; i<outputCount; i++)
					{
						Vec3 v( &quantizedOutput[i*3] );
						mQuantizedOutput.push_back(v);
					}
				}
				ret = &mQuantizedOutput[0].x;
			}
			HACD_FREE(quantizedOutput);
			HACD_FREE(quantizedIndices);
		}

		return ret;
	}